

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::compareGenMipmapBilinear
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec4 local_fc;
  Vector<float,_2> local_ec;
  byte local_e1;
  float local_e0;
  float fStack_dc;
  bool isOk;
  float cy;
  float cx;
  Vec4 result;
  int x;
  int y;
  int local_b8;
  undefined1 local_b4 [8];
  LookupPrecision lookupPrec;
  undefined1 local_78 [8];
  Sampler sampler;
  int numFailed;
  float srcH;
  float srcW;
  float dstH;
  float dstW;
  GenMipmapPrecision *precision_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *src_local;
  ConstPixelBufferAccess *dst_local;
  
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(dst);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(dst);
  iVar4 = tcu::ConstPixelBufferAccess::getWidth(src);
  iVar5 = tcu::ConstPixelBufferAccess::getHeight(src);
  sampler.depthStencilMode = (DepthStencilMode)(float)iVar5;
  sampler.seamlessCubeMap = false;
  sampler._53_3_ = 0;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(lookupPrec.colorThreshold.m_data + 3),0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            ((Sampler *)local_78,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,LINEAR,LINEAR,0.0,false,
             COMPAREMODE_NONE,0,(Vec4 *)(lookupPrec.colorThreshold.m_data + 3),false,MODE_DEPTH);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_b4);
  lookupPrec.uvwBits.m_data._4_8_ = *(undefined8 *)(precision->colorThreshold).m_data;
  lookupPrec.colorThreshold.m_data._0_8_ = *(undefined8 *)((precision->colorThreshold).m_data + 2);
  lookupPrec.colorThreshold.m_data[2] = *(float *)(precision->colorMask).m_data;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&x,0x16);
  local_b4._0_4_ = x;
  local_b4._4_4_ = y;
  lookupPrec.coordBits.m_data[0] = local_b8;
  lookupPrec.coordBits.m_data._4_8_ = *(undefined8 *)(precision->filterBits).m_data;
  lookupPrec.uvwBits.m_data[0] = (precision->filterBits).m_data[2];
  result.m_data[3] = 0.0;
  while( true ) {
    fVar1 = result.m_data[3];
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(dst);
    if (iVar5 <= (int)fVar1) break;
    result.m_data[2] = 0.0;
    while( true ) {
      fVar1 = result.m_data[2];
      iVar5 = tcu::ConstPixelBufferAccess::getWidth(dst);
      if (iVar5 <= (int)fVar1) break;
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&cy,(int)dst,(int)result.m_data[2],(int)result.m_data[3])
      ;
      fStack_dc = (((float)(int)result.m_data[2] + 0.5) / (float)iVar2) * (float)iVar4;
      local_e0 = (((float)(int)result.m_data[3] + 0.5) / (float)iVar3) *
                 (float)sampler.depthStencilMode;
      tcu::Vector<float,_2>::Vector(&local_ec,fStack_dc,local_e0);
      local_e1 = tcu::isLinearSampleResultValid
                           (src,(Sampler *)local_78,(LookupPrecision *)local_b4,&local_ec,0,
                            (Vec4 *)&cy);
      if ((bool)local_e1) {
        tcu::RGBA::green();
        tcu::RGBA::toVec((RGBA *)&local_fc);
      }
      else {
        tcu::RGBA::red();
        tcu::RGBA::toVec((RGBA *)&local_fc);
      }
      tcu::PixelBufferAccess::setPixel
                (errorMask,&local_fc,(int)result.m_data[2],(int)result.m_data[3],0);
      if ((local_e1 & 1) == 0) {
        sampler._52_4_ = sampler._52_4_ + 1;
      }
      result.m_data[2] = (float)((int)result.m_data[2] + 1);
    }
    result.m_data[3] = (float)((int)result.m_data[3] + 1);
  }
  return sampler._52_4_;
}

Assistant:

static int compareGenMipmapBilinear (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	// Translation to lookup verification parameters.
	const tcu::Sampler		sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
										 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR, 0.0f, false /* non-normalized coords */);
	tcu::LookupPrecision	lookupPrec;

	lookupPrec.colorThreshold	= precision.colorThreshold;
	lookupPrec.colorMask		= precision.colorMask;
	lookupPrec.coordBits		= tcu::IVec3(22);
	lookupPrec.uvwBits			= precision.filterBits;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const float		cx		= (float(x)+0.5f) / dstW * srcW;
		const float		cy		= (float(y)+0.5f) / dstH * srcH;
		const bool		isOk	= tcu::isLinearSampleResultValid(src, sampler, lookupPrec, tcu::Vec2(cx, cy), 0, result);

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}